

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O3

bool cmSystemTools::SplitProgramFromArgs(string *command,string *program,string *args)

{
  char *pcVar1;
  int iVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  pointer __s;
  
  __s = (command->_M_dataplus)._M_p + -1;
  do {
    bVar3 = __s[1];
    __s = __s + 1;
    iVar2 = isspace((uint)bVar3);
  } while (iVar2 != 0);
  if (bVar3 == 0) {
    bVar4 = true;
  }
  else {
    bVar5 = false;
    bVar6 = false;
    bVar4 = false;
    do {
      if (bVar5) {
        if (bVar3 != 0x27) goto LAB_001122c5;
        bVar5 = false;
      }
      else if (bVar4) {
        std::__cxx11::string::push_back((char)program);
        bVar4 = false;
      }
      else if (bVar3 == 0x5c) {
        bVar4 = true;
      }
      else if (bVar6) {
        if (bVar3 == 0x22) {
          bVar6 = false;
        }
        else {
LAB_001122c5:
          std::__cxx11::string::push_back((char)program);
        }
      }
      else if (bVar3 == 0x22) {
        bVar6 = true;
      }
      else {
        if (bVar3 != 0x27) {
          iVar2 = isspace((uint)bVar3);
          if (iVar2 == 0) goto LAB_001122c5;
          break;
        }
        bVar5 = true;
      }
      bVar3 = __s[1];
      __s = __s + 1;
    } while (bVar3 != 0);
    bVar4 = (bool)((bVar4 | bVar6 | bVar5) ^ 1);
  }
  pcVar1 = (char *)args->_M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)args,0,pcVar1,(ulong)__s);
  return bVar4;
}

Assistant:

bool cmSystemTools::SplitProgramFromArgs(std::string const& command,
                                         std::string& program,
                                         std::string& args)
{
  const char* c = command.c_str();

  // Skip leading whitespace.
  while (cmIsSpace(*c)) {
    ++c;
  }

  // Parse one command-line element up to an unquoted space.
  bool in_escape = false;
  bool in_double = false;
  bool in_single = false;
  for (; *c; ++c) {
    if (in_single) {
      if (*c == '\'') {
        in_single = false;
      } else {
        program += *c;
      }
    } else if (in_escape) {
      in_escape = false;
      program += *c;
    } else if (*c == '\\') {
      in_escape = true;
    } else if (in_double) {
      if (*c == '"') {
        in_double = false;
      } else {
        program += *c;
      }
    } else if (*c == '"') {
      in_double = true;
    } else if (*c == '\'') {
      in_single = true;
    } else if (cmIsSpace(*c)) {
      break;
    } else {
      program += *c;
    }
  }

  // The remainder of the command line holds unparsed arguments.
  args = c;

  return !in_single && !in_escape && !in_double;
}